

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  int iVar1;
  long in_RDI;
  SStream *in_stack_00000010;
  uint in_stack_0000001c;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = **(int **)(in_RDI + 0x310);
  if (((((1 < iVar1 - 0x9aU) && (iVar1 != 0xbe)) && (iVar1 != 0xc0)) &&
      ((iVar1 != 0x147 && (iVar1 != 0x149)))) && ((iVar1 != 0x283 && (iVar1 != 0x293)))) {
    SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
  }
  iVar1 = *(int *)(*(long *)(in_RDI + 800) + 4);
  if (iVar1 == 2) {
    iVar1 = **(int **)(in_RDI + 0x310);
    if (iVar1 - 0x9aU < 2) {
      *(undefined1 *)(in_RDI + 0x328) = 4;
    }
    else if (((iVar1 == 0x147) || (iVar1 == 0x149)) || ((iVar1 == 0x283 || (iVar1 == 0x293)))) {
      *(undefined1 *)(in_RDI + 0x328) = 6;
    }
    else {
      *(undefined1 *)(in_RDI + 0x328) = 2;
    }
  }
  else if (iVar1 == 4) {
    iVar1 = **(int **)(in_RDI + 0x310);
    if ((((iVar1 - 0x9aU < 2) || (iVar1 == 0x147)) || (iVar1 == 0x149)) ||
       ((iVar1 == 0x283 || (iVar1 == 0x293)))) {
      *(undefined1 *)(in_RDI + 0x328) = 6;
    }
    else {
      *(undefined1 *)(in_RDI + 0x328) = 4;
    }
  }
  else if (iVar1 == 8) {
    iVar1 = **(int **)(in_RDI + 0x310);
    if (((iVar1 - 0x9aU < 2) || (iVar1 == 0x147)) ||
       ((iVar1 == 0x149 || ((iVar1 == 0x283 || (iVar1 == 0x293)))))) {
      *(undefined1 *)(in_RDI + 0x328) = 10;
    }
    else {
      *(undefined1 *)(in_RDI + 0x328) = 8;
    }
  }
  printMemReference((MCInst *)O,in_stack_0000001c,in_stack_00000010);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->csh->mode) {
		case CS_MODE_16:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 2;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
					MI->x86opsize = 4;
					break;
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_32:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 4;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_64:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 8;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 10;
					break;
			}
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}